

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

void helper_ltr_x86_64(CPUX86State *env,int selector)

{
  target_ulong *ptVar1;
  abi_ptr addr;
  target_ulong tVar2;
  uint uVar3;
  int iVar4;
  uint32_t e1;
  uint32_t e2;
  uint32_t uVar5;
  uint32_t uVar6;
  uint error_code;
  abi_ptr addr_00;
  uintptr_t unaff_retaddr;
  
  error_code = selector & 0xfffc;
  if (error_code == 0) {
    (env->tr).base = 0;
    (env->tr).limit = 0;
    (env->tr).flags = 0;
    goto LAB_004d729f;
  }
  if ((selector & 4U) != 0) {
    raise_exception_err_ra_x86_64(env,0xd,error_code,unaff_retaddr);
  }
  uVar3 = selector & 0xfff8;
  if ((env->gdt).limit < uVar3 + (uint)((*(byte *)((long)&env->hflags + 1) & 0x40) >> 6) * 8 + 7) {
    raise_exception_err_ra_x86_64(env,0xd,error_code,unaff_retaddr);
  }
  tVar2 = (env->gdt).base;
  addr = tVar2 + uVar3;
  iVar4 = cpu_mmu_index_kernel(env);
  e1 = cpu_ldl_mmuidx_ra_x86_64(env,addr,iVar4,unaff_retaddr);
  addr_00 = tVar2 + uVar3 + 4;
  iVar4 = cpu_mmu_index_kernel(env);
  e2 = cpu_ldl_mmuidx_ra_x86_64(env,addr_00,iVar4,unaff_retaddr);
  if ((e2 & 0x1700) == 0x100) {
    if (-1 < (short)e2) {
      iVar4 = 0xb;
      goto LAB_004d72e1;
    }
    if ((env->hflags & 0x4000) == 0) {
      load_seg_cache_raw_dt(&env->tr,e1,e2);
    }
    else {
      iVar4 = cpu_mmu_index_kernel(env);
      uVar5 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 8,iVar4,unaff_retaddr);
      iVar4 = cpu_mmu_index_kernel(env);
      uVar6 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 0xc,iVar4,unaff_retaddr);
      if ((uVar6 & 0xf00) != 0) goto LAB_004d72b7;
      load_seg_cache_raw_dt(&env->tr,e1,e2);
      ptVar1 = &(env->tr).base;
      *ptVar1 = *ptVar1 | (ulong)uVar5 << 0x20;
    }
    iVar4 = cpu_mmu_index_kernel(env);
    cpu_stl_mmuidx_ra_x86_64(env,addr_00,e2 | 0x200,iVar4,unaff_retaddr);
LAB_004d729f:
    (env->tr).selector = selector & 0xffff;
    return;
  }
LAB_004d72b7:
  iVar4 = 0xd;
LAB_004d72e1:
  raise_exception_err_ra_x86_64(env,iVar4,error_code,unaff_retaddr);
}

Assistant:

void helper_ltr(CPUX86State *env, int selector)
{
    SegmentCache *dt;
    uint32_t e1, e2;
    int index, type, entry_limit;
    target_ulong ptr;

    selector &= 0xffff;
    if ((selector & 0xfffc) == 0) {
        /* NULL selector case: invalid TR */
        env->tr.base = 0;
        env->tr.limit = 0;
        env->tr.flags = 0;
    } else {
        if (selector & 0x4) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        dt = &env->gdt;
        index = selector & ~7;
#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            entry_limit = 15;
        } else
#endif
        {
            entry_limit = 7;
        }
        if ((index + entry_limit) > dt->limit) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        ptr = dt->base + index;
        e1 = cpu_ldl_kernel_ra(env, ptr, GETPC());
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, GETPC());
        type = (e2 >> DESC_TYPE_SHIFT) & 0xf;
        if ((e2 & DESC_S_MASK) ||
            (type != 1 && type != 9)) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, selector & 0xfffc, GETPC());
        }
#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            uint32_t e3, e4;

            e3 = cpu_ldl_kernel_ra(env, ptr + 8, GETPC());
            e4 = cpu_ldl_kernel_ra(env, ptr + 12, GETPC());
            if ((e4 >> DESC_TYPE_SHIFT) & 0xf) {
                raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
            }
            load_seg_cache_raw_dt(&env->tr, e1, e2);
            env->tr.base |= (target_ulong)e3 << 32;
        } else
#endif
        {
            load_seg_cache_raw_dt(&env->tr, e1, e2);
        }
        e2 |= DESC_TSS_BUSY_MASK;
        cpu_stl_kernel_ra(env, ptr + 4, e2, GETPC());
    }
    env->tr.selector = selector;
}